

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_hhmmss(CVmTimeZoneCache *this,char *prefix,char *name,size_t len)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong in_RCX;
  long in_RDX;
  char **in_RSI;
  int32_t *in_RDI;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  void *in_stack_00000010;
  int32_t ofs;
  size_t plen;
  int32_t in_stack_00000094;
  CVmTimeZoneCache *in_stack_00000098;
  CVmTimeZoneCache *in_stack_fffffffffffffff8;
  CVmTimeZone *pCVar4;
  
  sVar2 = strlen((char *)in_RSI);
  if (sVar2 == 0) {
LAB_0034d1f9:
    lVar3 = in_RCX - sVar2;
    iVar1 = parse_hhmmss(in_stack_fffffffffffffff8,in_RDI,in_RSI,(size_t *)(sVar2 + in_RDX),
                         (int)((ulong)lVar3 >> 0x20));
    if ((iVar1 == 0) || (lVar3 != 0)) {
      pCVar4 = (CVmTimeZone *)0x0;
    }
    else {
      pCVar4 = get_gmtofs_zone(in_stack_00000098,in_stack_00000094);
    }
  }
  else {
    if (sVar2 <= in_RCX) {
      iVar1 = memicmp(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      if (iVar1 == 0) goto LAB_0034d1f9;
    }
    pCVar4 = (CVmTimeZone *)0x0;
  }
  return pCVar4;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_hhmmss(
    VMG_ const char *prefix, const char *name, size_t len)
{
    /* check for the prefix - if it doesn't match, return failure */
    size_t plen = strlen(prefix);
    if (plen != 0 && (len < plen || memicmp(name, prefix, plen) != 0))
        return 0;

    /* skip the prefix */
    name += plen;
    len -= plen;

    /* parse the offset */
    int32_t ofs;
    if (!parse_hhmmss(ofs, name, len, TRUE) || len != 0)
        return 0;

    /* convert the hh:mm:ss value to seconds and look up the zone */
    return get_gmtofs_zone(vmg_ ofs);
}